

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O0

void pinger_on_close(uv_handle_t *handle)

{
  void *__ptr;
  int64_t eval_b;
  int64_t eval_a;
  pinger_t *pinger;
  uv_handle_t *handle_local;
  
  __ptr = handle->data;
  if ((ulong)*(uint *)((long)__ptr + 4) != 1000) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x48,"1000","==","pinger->pongs",1000,"==",(ulong)*(uint *)((long)__ptr + 4));
    abort();
  }
  if (handle == (uv_handle_t *)((long)__ptr + 0x10)) {
    free(__ptr);
  }
  else {
    uv_close((uv_handle_t *)((long)__ptr + 0x10),ponger_on_close);
    free(handle);
  }
  completed_pingers = completed_pingers + 1;
  return;
}

Assistant:

static void pinger_on_close(uv_handle_t* handle) {
  pinger_t* pinger = (pinger_t*) handle->data;

  ASSERT_EQ(NUM_PINGS, pinger->pongs);

  if (handle == (uv_handle_t*) &pinger->stream.tcp) {
    free(pinger); /* also frees handle */
  } else {
    uv_close((uv_handle_t*) &pinger->stream.tcp, ponger_on_close);
    free(handle);
  }

  completed_pingers++;
}